

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

void psa_rsa_oaep_set_padding_mode(psa_algorithm_t alg,mbedtls_rsa_context *rsa)

{
  mbedtls_md_type_t hash_id;
  mbedtls_md_info_t *md_info;
  psa_algorithm_t alg_00;
  
  alg_00 = 0;
  if ((alg & 0xffffff00) == 0x12030000) {
    alg_00 = alg & 0xff | 0x1000000;
  }
  md_info = mbedtls_md_info_from_psa(alg_00);
  hash_id = mbedtls_md_get_type(md_info);
  mbedtls_rsa_set_padding(rsa,1,hash_id);
  return;
}

Assistant:

static void psa_rsa_oaep_set_padding_mode( psa_algorithm_t alg,
                                           mbedtls_rsa_context *rsa )
{
    psa_algorithm_t hash_alg = PSA_ALG_RSA_OAEP_GET_HASH( alg );
    const mbedtls_md_info_t *md_info = mbedtls_md_info_from_psa( hash_alg );
    mbedtls_md_type_t md_alg = mbedtls_md_get_type( md_info );
    mbedtls_rsa_set_padding( rsa, MBEDTLS_RSA_PKCS_V21, md_alg );
}